

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mappingExample.cpp
# Opt level: O1

int GetMapping<int>(int mapMe,vector<int,_std::allocator<int>_> *mappings)

{
  int iVar1;
  pointer piVar2;
  ostream *poVar3;
  long *plVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  uint uVar9;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Mapping range: ",0xf);
  piVar2 = (mappings->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((mappings->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    uVar7 = 0;
    do {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,piVar2[uVar7]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      uVar7 = uVar7 + 1;
      piVar2 = (mappings->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(mappings->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                   .super__Vector_impl_data._M_finish - (long)piVar2 >> 2));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  piVar2 = (mappings->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  lVar5 = (long)(mappings->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  iVar6 = mapMe;
  if (lVar5 != 0) {
    bVar8 = true;
    uVar7 = 0;
    uVar9 = 0;
    do {
      iVar1 = piVar2[uVar7];
      if (mapMe <= iVar1) {
        bVar8 = false;
        iVar6 = iVar1;
      }
      uVar9 = (iVar1 < mapMe) + uVar9;
      uVar7 = (ulong)uVar9;
    } while ((uVar7 < (ulong)(lVar5 >> 2)) && (bVar8));
  }
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,mapMe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," is mapped to ",0xe);
  plVar4 = (long *)std::ostream::operator<<(poVar3,iVar6);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  return iVar6;
}

Assistant:

MapType GetMapping(MapType mapMe, vector<MapType> mappings){
   MapType result = mapMe;
   int i;
   bool keepLooking;

   keepLooking = true;

   cout << endl;
   cout << "Mapping range: ";
   for (i = 0; i < mappings.size(); ++i) {
      cout << mappings.at(i) << " ";
   }
   cout << endl;

   i = 0;       // Restart counting
   while ((i < mappings.size()) && keepLooking) {
      if(mapMe <= mappings.at(i)) {
         result = mappings.at(i);
         keepLooking = false;
      }
      else {
         ++i;
      }
   }

   cout << mapMe << " is mapped to " << result << endl;

   return result;
}